

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::FloatToBuffer(float value,char *buffer)

{
  bool bVar1;
  uint uVar2;
  char *in_RDI;
  float in_XMM0_Da;
  double dVar3;
  int snprintf_result_1;
  float parsed_value;
  int snprintf_result;
  float *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  float local_74;
  
  dVar3 = std::numeric_limits<double>::infinity();
  if (((double)in_XMM0_Da != dVar3) || (NAN((double)in_XMM0_Da) || NAN(dVar3))) {
    dVar3 = std::numeric_limits<double>::infinity();
    if (((double)in_XMM0_Da != -dVar3) || (NAN((double)in_XMM0_Da) || NAN(-dVar3))) {
      uVar2 = std::isnan((double)(ulong)(uint)in_XMM0_Da);
      if ((uVar2 & 1) == 0) {
        snprintf(in_RDI,0x18,"%.*g",(double)in_XMM0_Da,6);
        bVar1 = safe_strtof(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        if (((!bVar1) || (local_74 != in_XMM0_Da)) || (NAN(local_74) || NAN(in_XMM0_Da))) {
          snprintf(in_RDI,0x18,"%.*g",(double)in_XMM0_Da,9);
        }
        DelocalizeRadix(in_stack_ffffffffffffff30);
      }
      else {
        strcpy(in_RDI,"nan");
      }
    }
    else {
      strcpy(in_RDI,"-inf");
    }
  }
  else {
    strcpy(in_RDI,"inf");
  }
  return in_RDI;
}

Assistant:

char* FloatToBuffer(float value, char* buffer) {
  // FLT_DIG is 6 for IEEE-754 floats, which are used on almost all
  // platforms these days.  Just in case some system exists where FLT_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  GOOGLE_COMPILE_ASSERT(FLT_DIG < 10, FLT_DIG_is_too_big);

  if (value == std::numeric_limits<double>::infinity()) {
    strcpy(buffer, "inf");
    return buffer;
  } else if (value == -std::numeric_limits<double>::infinity()) {
    strcpy(buffer, "-inf");
    return buffer;
  } else if (std::isnan(value)) {
    strcpy(buffer, "nan");
    return buffer;
  }

  int snprintf_result =
    snprintf(buffer, kFloatToBufferSize, "%.*g", FLT_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);

  float parsed_value;
  if (!safe_strtof(buffer, &parsed_value) || parsed_value != value) {
    int snprintf_result =
      snprintf(buffer, kFloatToBufferSize, "%.*g", FLT_DIG+3, value);

    // Should never overflow; see above.
    GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);
  }

  DelocalizeRadix(buffer);
  return buffer;
}